

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void large_batch_write_no_commit_test(void)

{
  fdb_status fVar1;
  fdb_config *__ptr;
  size_t sVar2;
  size_t metalen;
  size_t bodylen;
  long unaff_RBX;
  char *pcVar3;
  ulong uVar4;
  fdb_config *fconfig;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  timeval __test_begin;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_doc *pfStack_6c8;
  fdb_kvs_handle *pfStack_6c0;
  fdb_file_handle *pfStack_6b8;
  timeval tStack_6b0;
  fdb_kvs_config fStack_6a0;
  fdb_config fStack_688;
  char acStack_590 [256];
  long lStack_490;
  fdb_config *pfStack_488;
  fdb_config *pfStack_480;
  fdb_file_handle *local_470;
  fdb_kvs_handle *local_468;
  fdb_kvs_config local_460;
  timeval local_448;
  char local_438 [264];
  fdb_config local_330;
  char local_238 [256];
  char local_138 [264];
  
  pfStack_480 = (fdb_config *)0x110dc8;
  gettimeofday(&local_448,(__timezone_ptr_t)0x0);
  pfStack_480 = (fdb_config *)0x110dcd;
  memleak_start();
  pfStack_480 = (fdb_config *)0x110dd7;
  __ptr = (fdb_config *)malloc(4000000);
  pfStack_480 = (fdb_config *)0x110de6;
  system("rm -rf  dummy* > errorlog.txt");
  fconfig = &local_330;
  pfStack_480 = (fdb_config *)0x110df6;
  fdb_get_default_config();
  pfStack_480 = (fdb_config *)0x110e00;
  fdb_get_default_kvs_config();
  pfStack_480 = (fdb_config *)0x110e14;
  fVar1 = fdb_open(&local_470,"./dummy1",fconfig);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStack_480 = (fdb_config *)0x110e32;
    fVar1 = fdb_kvs_open(local_470,&local_468,(char *)0x0,&local_460);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110fb7;
    unaff_RBX = 0;
    uVar4 = 0;
    do {
      pfStack_480 = (fdb_config *)0x110e5b;
      sprintf(local_138,"key%128d",uVar4 & 0xffffffff);
      pfStack_480 = (fdb_config *)0x110e77;
      sprintf(local_238,"meta%128d",uVar4 & 0xffffffff);
      pfStack_480 = (fdb_config *)0x110e8d;
      sprintf(local_438,"body%128d",uVar4 & 0xffffffff);
      pfStack_480 = (fdb_config *)0x110e99;
      sVar2 = strlen(local_138);
      pfStack_480 = (fdb_config *)0x110ea7;
      metalen = strlen(local_238);
      pfStack_480 = (fdb_config *)0x110eb4;
      bodylen = strlen(local_438);
      pfStack_480 = (fdb_config *)0x110ede;
      fdb_doc_create((fdb_doc **)((long)&__ptr->chunksize + unaff_RBX),local_138,sVar2,local_238,
                     metalen,local_438,bodylen);
      pfStack_480 = (fdb_config *)0x110eec;
      fdb_set(local_468,*(fdb_doc **)(&__ptr->chunksize + uVar4 * 4));
      pfStack_480 = (fdb_config *)0x110ef5;
      fdb_doc_free(*(fdb_doc **)(&__ptr->chunksize + uVar4 * 4));
      uVar4 = uVar4 + 1;
      unaff_RBX = unaff_RBX + 8;
    } while (uVar4 != 500000);
    pfStack_480 = (fdb_config *)0x110f13;
    fVar1 = fdb_kvs_close(local_468);
    fconfig = __ptr;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110fbc;
    pfStack_480 = (fdb_config *)0x110f25;
    fVar1 = fdb_close(local_470);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110fc1;
    pfStack_480 = (fdb_config *)0x110f46;
    fVar1 = fdb_open(&local_470,"./dummy1",&local_330);
    if (fVar1 == FDB_RESULT_NO_DB_HEADERS) {
LAB_00110f5d:
      pfStack_480 = (fdb_config *)0x110f65;
      free(__ptr);
      pfStack_480 = (fdb_config *)0x110f6a;
      fdb_shutdown();
      pfStack_480 = (fdb_config *)0x110f6f;
      memleak_end();
      pcVar3 = "%s PASSED\n";
      if (large_batch_write_no_commit_test()::__test_pass != '\0') {
        pcVar3 = "%s FAILED\n";
      }
      pfStack_480 = (fdb_config *)0x110fa0;
      fprintf(_stderr,pcVar3,"large batch write test with no commits");
      return;
    }
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_480 = (fdb_config *)0x110f59;
      fVar1 = fdb_close(local_470);
      if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00110f5d;
      goto LAB_00110fcb;
    }
  }
  else {
    pfStack_480 = (fdb_config *)0x110fb7;
    large_batch_write_no_commit_test();
LAB_00110fb7:
    pfStack_480 = (fdb_config *)0x110fbc;
    large_batch_write_no_commit_test();
LAB_00110fbc:
    pfStack_480 = (fdb_config *)0x110fc1;
    large_batch_write_no_commit_test();
LAB_00110fc1:
    pfStack_480 = (fdb_config *)0x110fc6;
    large_batch_write_no_commit_test();
  }
  pfStack_480 = (fdb_config *)0x110fcb;
  large_batch_write_no_commit_test();
LAB_00110fcb:
  pfStack_480 = (fdb_config *)set_get_meta_test;
  large_batch_write_no_commit_test();
  lStack_490 = unaff_RBX;
  pfStack_488 = fconfig;
  pfStack_480 = __ptr;
  gettimeofday(&tStack_6b0,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_688.wal_threshold = 0x400;
  fStack_688.seqtree_opt = '\x01';
  fStack_688.purging_interval = 1;
  fStack_688.flags = 1;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_open(&pfStack_6b8,"./dummy1",&fStack_688);
  fdb_kvs_open(pfStack_6b8,&pfStack_6c0,"db1",&fStack_6a0);
  sprintf(acStack_590,"key%d",0);
  sVar2 = strlen(acStack_590);
  fdb_doc_create(&pfStack_6c8,acStack_590,sVar2,(void *)0x0,0,(void *)0x0,0);
  fdb_set(pfStack_6c0,pfStack_6c8);
  fVar1 = fdb_get(pfStack_6c0,pfStack_6c8);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x345,"void set_get_meta_test()");
  }
  fVar1 = fdb_get_byoffset(pfStack_6c0,pfStack_6c8);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_get_metaonly(pfStack_6c0,pfStack_6c8);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fVar1 = fdb_get_metaonly_byseq(pfStack_6c0,pfStack_6c8);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        fdb_del(pfStack_6c0,pfStack_6c8);
        fVar1 = fdb_get(pfStack_6c0,pfStack_6c8);
        if (fVar1 == FDB_RESULT_KEY_NOT_FOUND) {
          if (pfStack_6c8->deleted == false) {
            __assert_fail("rdoc->deleted == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x350,"void set_get_meta_test()");
          }
          fVar1 = fdb_get_metaonly(pfStack_6c0,pfStack_6c8);
          if (fVar1 == FDB_RESULT_SUCCESS) {
            if (pfStack_6c8->deleted == false) {
              __assert_fail("rdoc->deleted == true",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0x354,"void set_get_meta_test()");
            }
            fVar1 = fdb_get_metaonly_byseq(pfStack_6c0,pfStack_6c8);
            if (fVar1 == FDB_RESULT_SUCCESS) {
              if (pfStack_6c8->deleted != false) {
                fVar1 = fdb_get_byoffset(pfStack_6c0,pfStack_6c8);
                if (fVar1 == FDB_RESULT_KEY_NOT_FOUND) {
                  if (pfStack_6c8->deleted != false) {
                    fdb_doc_free(pfStack_6c8);
                    fdb_kvs_close(pfStack_6c0);
                    fdb_close(pfStack_6b8);
                    fdb_shutdown();
                    memleak_end();
                    pcVar3 = "%s PASSED\n";
                    if (set_get_meta_test()::__test_pass != '\0') {
                      pcVar3 = "%s FAILED\n";
                    }
                    fprintf(_stderr,pcVar3,"set get meta test");
                    return;
                  }
                }
                else {
                  set_get_meta_test();
                }
                __assert_fail("rdoc->deleted == true",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                              ,0x35c,"void set_get_meta_test()");
              }
            }
            else {
              set_get_meta_test();
            }
            __assert_fail("rdoc->deleted == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x358,"void set_get_meta_test()");
          }
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x353,"void set_get_meta_test()");
        }
      }
      else {
        set_get_meta_test();
      }
      __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x34f,"void set_get_meta_test()");
    }
  }
  else {
    set_get_meta_test();
  }
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x349,"void set_get_meta_test()");
}

Assistant:

void large_batch_write_no_commit_test()
{
    TEST_INIT();
    memleak_start();

    int i, r;
    int n = 500000;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = (fdb_doc **) malloc(sizeof(fdb_doc *) * n);
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    char keybuf[256], metabuf[256], bodybuf[256];

    r = system(SHELL_DEL " dummy* > errorlog.txt");
    (void)r;

    // open dbfile
    fconfig = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Write 500K docs to eject and flush some dirty pages into disk.
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%128d", i);
        sprintf(metabuf, "meta%128d", i);
        sprintf(bodybuf, "body%128d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
        fdb_doc_free(doc[i]);
    }

    // close without commit
    status = fdb_kvs_close(db);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_close(dbfile);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_NO_DB_HEADERS ||
             status == FDB_RESULT_SUCCESS); // No dirty pages are flushed into disk.
    if (status == FDB_RESULT_SUCCESS) {
        status = fdb_close(dbfile);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    free(doc);
    fdb_shutdown();
    memleak_end();
    TEST_RESULT("large batch write test with no commits");
}